

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  cmInstallScriptGenerator *pcVar6;
  cmGlobalGenerator *this_00;
  bool bVar7;
  int iVar8;
  pointer pbVar9;
  bool exclude_from_all;
  ulong uVar10;
  allocator<char> local_99;
  string script;
  string component;
  string local_50;
  
  std::__cxx11::string::string((string *)&component,(string *)&this->DefaultComponentName);
  exclude_from_all = false;
  uVar10 = 0;
  iVar8 = 0;
  while( true ) {
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar1 - (long)pbVar9 >> 5) <= uVar10) break;
    bVar4 = std::operator==(pbVar9 + uVar10,"COMPONENT");
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((bVar4) &&
       (uVar10 + 1 <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))) {
      std::__cxx11::string::_M_assign((string *)&component);
      iVar8 = iVar8 + 1;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
    }
    bVar4 = std::operator==(pbVar9 + uVar10,"EXCLUDE_FROM_ALL");
    if (bVar4) {
      exclude_from_all = true;
    }
    uVar10 = uVar10 + 1;
  }
  if (iVar8 < 2) {
    bVar3 = false;
    bVar4 = false;
    for (; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
      bVar5 = std::operator==(pbVar9,"SCRIPT");
      if (bVar5) {
        bVar4 = true;
LAB_001c7c80:
        bVar3 = false;
      }
      else {
        bVar5 = std::operator==(pbVar9,"CODE");
        if (bVar5) {
          bVar3 = true;
          bVar4 = false;
        }
        else {
          bVar5 = std::operator==(pbVar9,"COMPONENT");
          if (bVar5) {
            bVar4 = false;
            goto LAB_001c7c80;
          }
          if (bVar4) {
            std::__cxx11::string::string((string *)&script,(string *)pbVar9);
            bVar4 = cmsys::SystemTools::FileIsFullPath(&script);
            if (!bVar4) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
              std::__cxx11::string::_M_assign((string *)&script);
              std::__cxx11::string::append((char *)&script);
              std::__cxx11::string::append((string *)&script);
            }
            bVar5 = cmsys::SystemTools::FileIsDirectory(&script);
            if (bVar5) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"given a directory as value of SCRIPT argument.",
                         &local_99);
              cmCommand::SetError(&this->super_cmCommand,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              pcVar2 = (this->super_cmCommand).Makefile;
              pcVar6 = (cmInstallScriptGenerator *)operator_new(0xf0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar6,script._M_dataplus._M_p,false,component._M_dataplus._M_p,
                         exclude_from_all);
              cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar6);
            }
            std::__cxx11::string::~string((string *)&script);
            bVar4 = false;
            bVar7 = false;
            if (bVar5) goto LAB_001c7e5a;
          }
          else if (bVar3) {
            pcVar2 = (this->super_cmCommand).Makefile;
            pcVar6 = (cmInstallScriptGenerator *)operator_new(0xf0);
            cmInstallScriptGenerator::cmInstallScriptGenerator
                      (pcVar6,(pbVar9->_M_dataplus)._M_p,true,component._M_dataplus._M_p,
                       exclude_from_all);
            cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)pcVar6);
            bVar3 = false;
          }
        }
      }
    }
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&script,"given no value for SCRIPT argument.",
                 (allocator<char> *)&local_50);
      cmCommand::SetError(&this->super_cmCommand,&script);
    }
    else {
      if (!bVar3) {
        this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        bVar7 = true;
        cmGlobalGenerator::AddInstallComponent(this_00,&component);
        goto LAB_001c7e5a;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&script,"given no value for CODE argument.",(allocator<char> *)&local_50)
      ;
      cmCommand::SetError(&this->super_cmCommand,&script);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&script,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator<char> *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&script);
  }
  std::__cxx11::string::~string((string *)&script);
  bVar7 = false;
LAB_001c7e5a:
  std::__cxx11::string::~string((string *)&component);
  return bVar7;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += arg;
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}